

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest.cpp
# Opt level: O1

bool rest_tx(any *context,HTTPRequest *req,string *strURIPart)

{
  pointer pcVar1;
  span<const_std::byte,_18446744073709551615UL> reply;
  span<const_std::byte,_18446744073709551615UL> reply_00;
  bool bVar2;
  RESTResponseFormat RVar3;
  NodeContext *pNVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  char *in_RCX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  _Alloc_hider _Var7;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  string_view str;
  span<const_std::byte,_18446744073709551615UL> reply_01;
  CTransactionRef tx;
  DataStream ssTx;
  string strHex;
  optional<uint256> hash;
  string hashStr;
  CTransaction *in_stack_fffffffffffffe08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1f0;
  string local_1e8;
  undefined1 *local_1c8;
  undefined8 local_1c0;
  undefined1 local_1b8 [9];
  undefined4 local_1af;
  undefined2 local_1ab;
  char local_1a9;
  undefined1 local_1a8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_190;
  pointer local_180;
  pointer pbStack_178;
  pointer local_170;
  pointer pUStack_168;
  pointer local_160;
  pointer pUStack_158;
  string local_148;
  undefined1 local_128 [32];
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  uint256 local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  optional<uint256> local_79;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = CheckWarmup(req);
  if (!bVar2) {
    bVar2 = false;
    goto LAB_009a5692;
  }
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  RVar3 = ParseDataFormat(&local_58,strURIPart);
  str._M_str = in_RCX;
  str._M_len = (size_t)local_58._M_dataplus._M_p;
  detail::FromHex<uint256>(&local_79,(detail *)local_58._M_string_length,str);
  if (local_79.super__Optional_base<uint256,_true,_true>._M_payload.
      super__Optional_payload_base<uint256>._M_engaged == false) {
    std::operator+(&local_a0,"Invalid hash: ",&local_58);
    RESTERR(req,HTTP_BAD_REQUEST,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
LAB_009a5147:
    bVar2 = false;
  }
  else {
    if ((__uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>)
        g_txindex._M_t.super___uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>._M_t.
        super__Tuple_impl<0UL,_TxIndex_*,_std::default_delete<TxIndex>_>.
        super__Head_base<0UL,_TxIndex_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>)0x0) {
      BaseIndex::BlockUntilSyncedToCurrentChain
                ((BaseIndex *)
                 g_txindex._M_t.super___uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>._M_t.
                 super__Tuple_impl<0UL,_TxIndex_*,_std::default_delete<TxIndex>_>.
                 super__Head_base<0UL,_TxIndex_*,_false>._M_head_impl);
    }
    pNVar4 = util::AnyPtr<node::NodeContext>(context);
    if (pNVar4 == (NodeContext *)0x0) {
      local_c8.super_base_blob<256U>.m_data._M_elems._0_4_ = 0x5d;
      tinyformat::format<char[82],int,char[15],char[42]>
                ((string *)local_1a8,
                 (tinyformat *)
                 "%s:%d (%s)\nInternal bug detected: Node context not found!\nYou may report this issue here: %s\n"
                 ,
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rest.cpp"
                 ,(char (*) [82])&local_c8,(int *)"GetNodeContext",
                 (char (*) [15])"https://github.com/bitcoin/bitcoin/issues",
                 (char (*) [42])in_stack_fffffffffffffe08);
      RESTERR(req,HTTP_INTERNAL_SERVER_ERROR,(string *)local_1a8);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      pNVar4 = (NodeContext *)0x0;
    }
    if (pNVar4 == (NodeContext *)0x0) goto LAB_009a5147;
    local_c8.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    local_c8.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    local_c8.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    local_c8.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    local_c8.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    local_c8.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    local_c8.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    local_c8.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    local_c8.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    local_c8.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    local_c8.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    local_c8.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    local_c8.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    local_c8.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    local_c8.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    local_c8.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    local_c8.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    local_c8.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    local_c8.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    local_c8.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    local_c8.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    local_c8.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    local_c8.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    local_c8.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    local_c8.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    local_c8.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    local_c8.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    local_c8.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    local_c8.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    local_c8.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    local_c8.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    local_c8.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    node::GetTransaction
              ((node *)&stack0xfffffffffffffe08,(CBlockIndex *)0x0,
               (pNVar4->mempool)._M_t.
               super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
               super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
               super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,(uint256 *)&local_79,
               &local_c8,
               &((pNVar4->chainman)._M_t.
                 super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                 .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_blockman);
    if (in_stack_fffffffffffffe08 == (CTransaction *)0x0) {
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e8,local_58._M_dataplus._M_p,
                 (detail *)(local_58._M_string_length + (long)local_58._M_dataplus._M_p));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_e8," not found");
      RESTERR(req,HTTP_NOT_FOUND,&local_e8);
      _Var7._M_p = local_e8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
LAB_009a565c:
        operator_delete(_Var7._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
LAB_009a5664:
      bVar2 = false;
    }
    else {
      if (RVar3 == JSON) {
        local_1c8 = local_1b8;
        local_1c0 = 0;
        local_1a8._8_8_ = &aStack_190;
        local_1a8._0_4_ = 1;
        aStack_190._M_local_buf[0] = '\0';
        aStack_190._1_7_ = (undefined7)local_1b8._1_8_;
        aStack_190._M_local_buf[8] = SUB81(local_1b8._1_8_,7);
        aStack_190._9_4_ = local_1af;
        aStack_190._13_2_ = local_1ab;
        aStack_190._M_local_buf[0xf] = local_1a9;
        local_1a8._16_8_ = 0;
        local_1b8[0] = 0;
        local_180 = (pointer)0x0;
        pbStack_178 = (pointer)0x0;
        local_170 = (pointer)0x0;
        pUStack_168 = (pointer)0x0;
        local_160 = (pointer)0x0;
        pUStack_158 = (pointer)0x0;
        TxToUniv(in_stack_fffffffffffffe08,&local_c8,(UniValue *)local_1a8,true,(CTxUndo *)0x0,
                 SHOW_DETAILS);
        UniValue::write_abi_cxx11_((UniValue *)local_128,(int)local_1a8,(void *)0x0,0);
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_128,"\n");
        local_108._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
        paVar6 = &pbVar5->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p == paVar6) {
          local_108.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
          local_108.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        }
        else {
          local_108.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        }
        local_108._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        pcVar1 = local_128 + 0x10;
        if ((pointer)local_128._0_8_ != pcVar1) {
          operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
        }
        local_128._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"Content-Type","");
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"application/json","");
        HTTPRequest::WriteHeader(req,(string *)local_128,&local_148);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_128._0_8_ != pcVar1) {
          operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
        }
        reply_00._M_extent._M_extent_value = local_108._M_string_length;
        reply_00._M_ptr = (pointer)local_108._M_dataplus._M_p;
        HTTPRequest::WriteReply(req,200,reply_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        UniValue::~UniValue((UniValue *)local_1a8);
      }
      else {
        if (RVar3 == HEX) {
          local_108._M_string_length = (size_type)local_1a8;
          local_1a8._16_8_ = 0;
          aStack_190._M_local_buf[0] = '\0';
          aStack_190._1_7_ = 0;
          local_1a8._0_8_ = (pointer)0x0;
          local_1a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_108._M_dataplus._M_p = &TX_WITH_WITNESS.allow_witness;
          SerializeTransaction<ParamsStream<DataStream&,TransactionSerParams>,CTransaction>
                    (in_stack_fffffffffffffe08,
                     (ParamsStream<DataStream_&,_TransactionSerParams> *)&local_108,&TX_WITH_WITNESS
                    );
          s.m_data = (uchar *)(local_1a8._0_8_ +
                              CONCAT71(aStack_190._1_7_,aStack_190._M_local_buf[0]));
          s.m_size = local_1a8._8_8_ - (long)s.m_data;
          HexStr_abi_cxx11_((string *)local_128,s);
          pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_128,"\n");
          local_108._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
          paVar6 = &pbVar5->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p == paVar6) {
            local_108.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
            local_108.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
            local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          }
          else {
            local_108.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
          }
          local_108._M_string_length = pbVar5->_M_string_length;
          (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
          pbVar5->_M_string_length = 0;
          (pbVar5->field_2)._M_local_buf[0] = '\0';
          pcVar1 = local_128 + 0x10;
          if ((pointer)local_128._0_8_ != pcVar1) {
            operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
          }
          local_128._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"Content-Type","");
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"text/plain","");
          HTTPRequest::WriteHeader(req,(string *)local_128,&local_148);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
          if ((pointer)local_128._0_8_ != pcVar1) {
            operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
          }
          reply._M_extent._M_extent_value = local_108._M_string_length;
          reply._M_ptr = (pointer)local_108._M_dataplus._M_p;
          HTTPRequest::WriteReply(req,200,reply);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          if (RVar3 != BINARY) {
            AvailableDataFormatsString_abi_cxx11_();
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1a8,"output format not found (available: ",&local_108);
            pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_1a8,")");
            local_1e8._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
            paVar6 = &pbVar5->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p == paVar6) {
              local_1e8.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
              local_1e8.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
              local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
            }
            else {
              local_1e8.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
            }
            local_1e8._M_string_length = pbVar5->_M_string_length;
            (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
            pbVar5->_M_string_length = 0;
            (pbVar5->field_2)._M_local_buf[0] = '\0';
            RESTERR(req,HTTP_NOT_FOUND,&local_1e8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
              operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
            local_e8.field_2._M_allocated_capacity = local_108.field_2._M_allocated_capacity;
            _Var7._M_p = local_108._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_dataplus._M_p != &local_108.field_2) goto LAB_009a565c;
            goto LAB_009a5664;
          }
          local_108._M_string_length = (size_type)local_1a8;
          local_1a8._16_8_ = 0;
          aStack_190._M_local_buf[0] = '\0';
          aStack_190._1_7_ = 0;
          local_1a8._0_8_ = (pointer)0x0;
          local_1a8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_108._M_dataplus._M_p = &TX_WITH_WITNESS.allow_witness;
          SerializeTransaction<ParamsStream<DataStream&,TransactionSerParams>,CTransaction>
                    (in_stack_fffffffffffffe08,
                     (ParamsStream<DataStream_&,_TransactionSerParams> *)&local_108,&TX_WITH_WITNESS
                    );
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"Content-Type","");
          local_128._0_8_ = local_128 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_128,"application/octet-stream","");
          HTTPRequest::WriteHeader(req,&local_108,(string *)local_128);
          if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
            operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
          reply_01._M_ptr =
               (pointer)(local_1a8._0_8_ + CONCAT71(aStack_190._1_7_,aStack_190._M_local_buf[0]));
          reply_01._M_extent._M_extent_value = local_1a8._8_8_ - (long)reply_01._M_ptr;
          HTTPRequest::WriteReply(req,200,reply_01);
        }
        std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                  ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_1a8);
      }
      bVar2 = true;
    }
    if (local_1f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1f0);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
LAB_009a5692:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

static bool rest_tx(const std::any& context, HTTPRequest* req, const std::string& strURIPart)
{
    if (!CheckWarmup(req))
        return false;
    std::string hashStr;
    const RESTResponseFormat rf = ParseDataFormat(hashStr, strURIPart);

    auto hash{uint256::FromHex(hashStr)};
    if (!hash) {
        return RESTERR(req, HTTP_BAD_REQUEST, "Invalid hash: " + hashStr);
    }

    if (g_txindex) {
        g_txindex->BlockUntilSyncedToCurrentChain();
    }

    const NodeContext* const node = GetNodeContext(context, req);
    if (!node) return false;
    uint256 hashBlock = uint256();
    const CTransactionRef tx{GetTransaction(/*block_index=*/nullptr, node->mempool.get(), *hash, hashBlock, node->chainman->m_blockman)};
    if (!tx) {
        return RESTERR(req, HTTP_NOT_FOUND, hashStr + " not found");
    }

    switch (rf) {
    case RESTResponseFormat::BINARY: {
        DataStream ssTx;
        ssTx << TX_WITH_WITNESS(tx);

        req->WriteHeader("Content-Type", "application/octet-stream");
        req->WriteReply(HTTP_OK, ssTx);
        return true;
    }

    case RESTResponseFormat::HEX: {
        DataStream ssTx;
        ssTx << TX_WITH_WITNESS(tx);

        std::string strHex = HexStr(ssTx) + "\n";
        req->WriteHeader("Content-Type", "text/plain");
        req->WriteReply(HTTP_OK, strHex);
        return true;
    }

    case RESTResponseFormat::JSON: {
        UniValue objTx(UniValue::VOBJ);
        TxToUniv(*tx, /*block_hash=*/hashBlock, /*entry=*/ objTx);
        std::string strJSON = objTx.write() + "\n";
        req->WriteHeader("Content-Type", "application/json");
        req->WriteReply(HTTP_OK, strJSON);
        return true;
    }

    default: {
        return RESTERR(req, HTTP_NOT_FOUND, "output format not found (available: " + AvailableDataFormatsString() + ")");
    }
    }
}